

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O3

void __thiscall
TPZTransfer<std::complex<double>_>::AddBlockNumbers
          (TPZTransfer<std::complex<double>_> *this,int row,TPZVec<int> *colnumbers)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  
  piVar2 = (this->fColPosition).fStore;
  if (piVar2[row] != -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZTransfer:SetBlocks called for an already defined row = ",
               0x3a);
    plVar4 = (long *)std::ostream::operator<<(&std::cout,row);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Solvers/Multigrid/pztransfer.cpp"
               ,0x7d);
  }
  piVar2[row] = this->fColumnBlockLastUsed;
  iVar1 = (int)colnumbers->fNElements;
  (this->fNumberofColumnBlocks).fStore[row] = iVar1;
  ExpandColumnVectorEntries(this,iVar1);
  iVar1 = this->fColumnBlockLastUsed;
  lVar5 = (long)iVar1;
  iVar6 = (int)colnumbers->fNElements + iVar1;
  if (iVar1 < iVar6) {
    piVar2 = colnumbers->fStore;
    piVar3 = (this->fColumnBlockNumber).super_TPZVec<int>.fStore;
    do {
      piVar3[lVar5] = piVar2[lVar5 - this->fColumnBlockLastUsed];
      lVar5 = lVar5 + 1;
    } while (iVar6 != lVar5);
  }
  this->fColumnBlockLastUsed = iVar6;
  return;
}

Assistant:

void TPZTransfer<TVar>::AddBlockNumbers(int row, TPZVec<int> &colnumbers){
	if(HasRowDefinition(row)) {
		cout << "TPZTransfer:SetBlocks called for an already defined row = " <<
		row << endl;
		DebugStop();
	}
	fColPosition[row] = fColumnBlockLastUsed;
	fNumberofColumnBlocks[row] = colnumbers.NElements();
	// will specify the sparsity pattern of row
	ExpandColumnVectorEntries(colnumbers.NElements());
	int ic= fColumnBlockLastUsed, lastic = ic+colnumbers.NElements();
	for(;ic < lastic; ic++) {
		fColumnBlockNumber[ic] = colnumbers[ic-fColumnBlockLastUsed];
	}
	fColumnBlockLastUsed = lastic;
}